

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O1

FT_Error afm_parser_parse(AFM_Parser parser)

{
  FT_Memory pFVar1;
  AFM_Stream pAVar2;
  byte bVar3;
  int iVar4;
  AFM_Token AVar5;
  FT_Int FVar6;
  FT_UInt FVar7;
  char *pcVar8;
  AFM_KernPair pAVar9;
  ulong uVar10;
  AFM_TrackKern pAVar11;
  FT_Int FVar12;
  FT_Offset *in_RDX;
  FT_Offset *extraout_RDX;
  FT_Offset *len_00;
  FT_Offset *extraout_RDX_00;
  FT_Offset *extraout_RDX_01;
  FT_Offset *extraout_RDX_02;
  FT_Offset *extraout_RDX_03;
  FT_Offset *extraout_RDX_04;
  FT_Offset *extraout_RDX_05;
  FT_Offset *pFVar13;
  FT_Offset *extraout_RDX_06;
  FT_Offset *extraout_RDX_07;
  FT_Offset *extraout_RDX_08;
  FT_Offset *extraout_RDX_09;
  FT_Offset *extraout_RDX_10;
  FT_Offset *extraout_RDX_11;
  FT_Offset *extraout_RDX_12;
  FT_Offset *extraout_RDX_13;
  FT_Offset *extraout_RDX_14;
  FT_Offset *extraout_RDX_15;
  FT_Offset *extraout_RDX_16;
  FT_Offset *extraout_RDX_17;
  FT_Offset *extraout_RDX_18;
  FT_Offset *extraout_RDX_19;
  FT_Offset *extraout_RDX_20;
  FT_Offset *extraout_RDX_21;
  FT_Offset *extraout_RDX_22;
  uint uVar14;
  ulong uVar15;
  FT_Offset *pFVar16;
  FT_Error FVar17;
  AFM_FontInfo pAVar18;
  AFM_ValueType_ AVar19;
  AFM_ValueType_ AVar20;
  AFM_ValueType_ AVar21;
  bool bVar22;
  FT_Offset len;
  AFM_ValueRec shared_vals [4];
  FT_Offset len_1;
  FT_Offset local_d0;
  FT_Offset *local_c8;
  AFM_ValueType_ local_bc;
  AFM_ValueRec_ local_b8;
  undefined4 local_a8;
  FT_UInt local_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  FT_Int local_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  FT_Int local_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  FT_Fixed local_70;
  FT_Offset local_68;
  FT_Offset local_60;
  AFM_ValueType_ local_54;
  ulong local_50;
  AFM_FontInfo local_48;
  ulong local_40;
  FT_Memory local_38;
  
  pAVar18 = parser->FontInfo;
  if (pAVar18 == (AFM_FontInfo)0x0) {
    FVar17 = 6;
  }
  else {
    pFVar1 = parser->memory;
    pcVar8 = afm_parser_next_key(parser,(FT_Bool)&local_d0,in_RDX);
    AVar20 = AFM_VALUE_TYPE_FIXED;
    FVar17 = 2;
    if (((pcVar8 != (char *)0x0) && (local_d0 == 0x10)) &&
       (iVar4 = strncmp(pcVar8,"StartFontMetrics",0x10), iVar4 == 0)) {
      local_50 = 0;
      pFVar13 = extraout_RDX;
      AVar19 = 0xa0;
      local_48 = pAVar18;
      local_38 = pFVar1;
LAB_00233383:
      pcVar8 = afm_parser_next_key(parser,(FT_Bool)&local_d0,pFVar13);
      AVar21 = AVar19;
      if (pcVar8 != (char *)0x0) {
        AVar5 = afm_tokenize(pcVar8,local_d0);
        bVar3 = 1;
        pFVar13 = len_00;
        if (0x1d < (int)AVar5) {
          if ((int)AVar5 < 0x2d) {
            if (AVar5 == AFM_TOKEN_ISCIDFONT) {
              local_b8.type = AFM_VALUE_TYPE_BOOL;
              FVar6 = afm_parser_read_vals(parser,&local_b8,1);
              bVar3 = 5;
              pFVar13 = extraout_RDX_18;
              if (FVar6 != 1) goto LAB_00233af9;
              pAVar18->IsCIDFont = local_b8.u.b;
            }
            else if (AVar5 == AFM_TOKEN_METRICSSETS) {
              local_b8.type = AFM_VALUE_TYPE_INTEGER;
              FVar6 = afm_parser_read_vals(parser,&local_b8,1);
              if (FVar6 == 1) {
                local_50 = (ulong)local_b8.u.u;
              }
              bVar3 = 5;
              pFVar13 = extraout_RDX_01;
              if ((FVar6 != 1) ||
                 (AVar21 = AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_INTEGER, (local_50 & 0xfffffffd) != 0)
                 ) goto LAB_00233af9;
            }
            goto LAB_00233a06;
          }
          if (AVar5 != AFM_TOKEN_STARTCHARMETRICS) {
            if (AVar5 != AFM_TOKEN_STARTKERNDATA) goto LAB_00233a06;
            local_54 = AVar20;
            pcVar8 = afm_parser_next_key(parser,(FT_Bool)&local_68,len_00);
            pFVar13 = extraout_RDX_03;
            if (pcVar8 != (char *)0x0) {
              bVar22 = false;
              local_c8 = (FT_Offset *)((ulong)local_c8 & 0xffffffff00000000);
              do {
                AVar5 = afm_tokenize(pcVar8,local_68);
                pFVar13 = extraout_RDX_04;
                if ((int)AVar5 < 0x35) {
                  if (1 < AVar5 - AFM_TOKEN_STARTKERNPAIRS) {
                    AVar21 = AFM_VALUE_TYPE_STRING;
                    if (AVar5 - AFM_TOKEN_ENDFONTMETRICS < 2) goto LAB_00233acc;
                    break;
                  }
                  if (bVar22) break;
                  pAVar2 = parser->stream;
                  pAVar18 = parser->FontInfo;
                  local_b8.type = AFM_VALUE_TYPE_INTEGER;
                  FVar6 = afm_parser_read_vals(parser,&local_b8,1);
                  pFVar13 = extraout_RDX_05;
                  if (local_b8.u.i < 0 || FVar6 != 1) {
LAB_002335a4:
                    AVar21 = 0xa0;
                  }
                  else {
                    pAVar18->NumKernPair = local_b8.u.i;
                    pFVar13 = (FT_Offset *)
                              ((ulong)((long)pAVar2->limit - (long)pAVar2->cursor) / 10);
                    if (pFVar13 < (FT_Offset *)(ulong)local_b8.u.u) goto LAB_002335a4;
                    AVar20 = AVar21;
                    if (local_b8.u.i == 0) {
LAB_00233699:
                      uVar15 = 0xffffffff;
                      do {
                        pcVar8 = afm_parser_next_key(parser,(FT_Bool)&local_60,pFVar13);
                        if (pcVar8 == (char *)0x0) {
                          AVar21 = 0xa0;
                          pFVar13 = extraout_RDX_09;
                          goto LAB_002335aa;
                        }
                        AVar5 = afm_tokenize(pcVar8,local_60);
                        iVar4 = 2;
                        uVar10 = (ulong)(AVar5 - AFM_TOKEN_ENDFONTMETRICS);
                        pFVar13 = extraout_RDX_10;
                        if (AVar5 - AFM_TOKEN_ENDFONTMETRICS < 0x38) {
                          if ((7UL >> (uVar10 & 0x3f) & 1) == 0) {
                            if ((0x34000UL >> (uVar10 & 0x3f) & 1) == 0) {
                              if (uVar10 == 0x37) goto LAB_002337eb;
                            }
                            else {
                              uVar14 = (int)uVar15 + 1;
                              uVar15 = (ulong)uVar14;
                              iVar4 = 2;
                              if ((int)uVar14 < (int)pAVar18->NumKernPair) {
                                pAVar9 = pAVar18->KernPairs + (int)uVar14;
                                local_b8.type = AFM_VALUE_TYPE_INDEX;
                                local_a8 = 5;
                                local_98 = 3;
                                local_88 = 3;
                                local_bc = AVar20;
                                local_40 = uVar15;
                                FVar6 = afm_parser_read_vals(parser,&local_b8,4);
                                pFVar13 = extraout_RDX_11;
                                uVar15 = local_40;
                                AVar20 = local_bc;
                                if (FVar6 < 3) {
                                  bVar22 = false;
                                }
                                else {
                                  pAVar9->index1 = local_b8.u.i;
                                  pAVar9->index2 = local_a0;
                                  if (AVar5 == AFM_TOKEN_KPY) {
                                    pAVar9->x = 0;
                                    FVar12 = local_90;
                                  }
                                  else {
                                    pAVar9->x = local_90;
                                    FVar12 = 0;
                                    if (FVar6 == 4 && AVar5 == AFM_TOKEN_KP) {
                                      FVar12 = local_80;
                                    }
                                  }
                                  pAVar9->y = FVar12;
                                  bVar22 = true;
                                  iVar4 = 0;
                                }
                              }
                              else {
                                bVar22 = false;
                              }
                              if (bVar22) {
LAB_002337eb:
                                iVar4 = 0;
                              }
                            }
                          }
                          else {
                            FVar7 = (int)uVar15 + 1;
                            if (FVar7 != pAVar18->NumKernPair) {
                              pAVar18->NumKernPair = FVar7;
                            }
                            qsort(pAVar18->KernPairs,(ulong)pAVar18->NumKernPair,0x10,
                                  afm_compare_kern_pairs);
                            AVar20 = AFM_VALUE_TYPE_STRING;
                            iVar4 = 1;
                            pFVar13 = extraout_RDX_12;
                          }
                        }
                      } while (iVar4 == 0);
                      AVar21 = 0xa0;
                      if (iVar4 != 2) {
                        AVar21 = AVar20;
                      }
                    }
                    else {
                      pAVar9 = (AFM_KernPair)
                               ft_mem_qrealloc(parser->memory,0x10,0,(FT_Long)(ulong)local_b8.u.u,
                                               (void *)0x0,(FT_Error *)&local_b8);
                      pAVar18->KernPairs = pAVar9;
                      pFVar13 = extraout_RDX_08;
                      AVar21 = local_b8.type;
                      AVar20 = local_b8.type;
                      if (local_b8.type == AFM_VALUE_TYPE_STRING) goto LAB_00233699;
                    }
                  }
LAB_002335aa:
                  bVar22 = true;
joined_r0x0023364d:
                  if (AVar21 != AFM_VALUE_TYPE_STRING) goto LAB_00233acc;
                }
                else if (AVar5 != AFM_TOKEN_UNKNOWN) {
                  if ((AVar5 == AFM_TOKEN_STARTTRACKKERN) && ((int)local_c8 == 0)) {
                    pAVar2 = parser->stream;
                    pAVar18 = parser->FontInfo;
                    local_b8.type = AFM_VALUE_TYPE_INTEGER;
                    FVar6 = afm_parser_read_vals(parser,&local_b8,1);
                    pFVar13 = extraout_RDX_06;
                    if (local_b8.u.i < 0 || FVar6 != 1) {
LAB_00233637:
                      AVar21 = 0xa0;
                    }
                    else {
                      pAVar18->NumTrackKern = local_b8.u.i;
                      pFVar13 = (FT_Offset *)
                                ((ulong)((long)pAVar2->limit - (long)pAVar2->cursor) / 0x14);
                      if (pFVar13 < (FT_Offset *)(ulong)local_b8.u.u) goto LAB_00233637;
                      AVar20 = AVar21;
                      if (local_b8.u.i == 0) {
LAB_0023384a:
                        pFVar16 = (FT_Offset *)0xffffffff;
                        do {
                          pcVar8 = afm_parser_next_key(parser,(FT_Bool)&local_60,pFVar13);
                          if (pcVar8 == (char *)0x0) {
                            AVar21 = 0xa0;
                            pFVar13 = extraout_RDX_14;
                            goto LAB_0023363d;
                          }
                          AVar5 = afm_tokenize(pcVar8,local_60);
                          iVar4 = 2;
                          pFVar13 = extraout_RDX_15;
                          if ((int)AVar5 < 0x38) {
                            if ((AVar5 - AFM_TOKEN_ENDFONTMETRICS < 2) ||
                               (AVar5 == AFM_TOKEN_ENDTRACKKERN)) {
                              FVar7 = (int)pFVar16 + 1;
                              iVar4 = 1;
                              AVar20 = AFM_VALUE_TYPE_STRING;
                              if (FVar7 != pAVar18->NumTrackKern) {
                                pAVar18->NumTrackKern = FVar7;
                              }
                            }
                          }
                          else if (AVar5 == AFM_TOKEN_UNKNOWN) {
LAB_00233945:
                            iVar4 = 0;
                          }
                          else if ((AVar5 == AFM_TOKEN_TRACKKERN) &&
                                  (uVar14 = (int)pFVar16 + 1, pFVar16 = (FT_Offset *)(ulong)uVar14,
                                  (int)uVar14 < (int)pAVar18->NumTrackKern)) {
                            pAVar11 = pAVar18->TrackKerns;
                            local_b8.type = AFM_VALUE_TYPE_INTEGER;
                            local_a8 = 2;
                            local_98 = 2;
                            local_88 = 2;
                            local_78 = 2;
                            local_c8 = (FT_Offset *)(ulong)uVar14;
                            FVar6 = afm_parser_read_vals(parser,&local_b8,5);
                            pFVar13 = extraout_RDX_16;
                            pFVar16 = local_c8;
                            if (FVar6 == 5) {
                              iVar4 = (int)local_c8;
                              pAVar11[iVar4].degree = local_b8.u.i;
                              pAVar11[iVar4].min_ptsize = CONCAT44(uStack_9c,local_a0);
                              pAVar11[iVar4].min_kern = CONCAT44(uStack_8c,local_90);
                              pAVar11[iVar4].max_ptsize = CONCAT44(uStack_7c,local_80);
                              pAVar11[iVar4].max_kern = local_70;
                              pFVar13 = local_c8;
                              goto LAB_00233945;
                            }
                          }
                        } while (iVar4 == 0);
                        AVar21 = 0xa0;
                        if (iVar4 != 2) {
                          AVar21 = AVar20;
                        }
                      }
                      else {
                        pAVar11 = (AFM_TrackKern)
                                  ft_mem_qrealloc(parser->memory,0x28,0,(FT_Long)(ulong)local_b8.u.u
                                                  ,(void *)0x0,(FT_Error *)&local_b8);
                        pAVar18->TrackKerns = pAVar11;
                        pFVar13 = extraout_RDX_13;
                        AVar20 = local_b8.type;
                        AVar21 = local_b8.type;
                        if (local_b8.type == AFM_VALUE_TYPE_STRING) goto LAB_0023384a;
                      }
                    }
LAB_0023363d:
                    local_c8 = (FT_Offset *)CONCAT44(local_c8._4_4_,1);
                    goto joined_r0x0023364d;
                  }
                  break;
                }
                pcVar8 = afm_parser_next_key(parser,(FT_Bool)&local_68,pFVar13);
                pFVar13 = extraout_RDX_07;
              } while (pcVar8 != (char *)0x0);
            }
            AVar21 = 0xa0;
LAB_00233acc:
            pAVar18 = local_48;
            if (AVar21 == AFM_VALUE_TYPE_STRING) {
              AVar20 = AFM_VALUE_TYPE_STRING;
              AVar21 = AFM_VALUE_TYPE_STRING;
              bVar3 = 1;
            }
            else {
              bVar3 = 5;
              AVar20 = local_54;
            }
            goto LAB_00233af9;
          }
          local_b8.type = AFM_VALUE_TYPE_INTEGER;
          FVar6 = afm_parser_read_vals(parser,&local_b8,1);
          if (FVar6 == 1) {
            iVar4 = local_b8.u.i + 1;
            pFVar13 = extraout_RDX_19;
            do {
              iVar4 = iVar4 + -1;
              if (iVar4 < 1) goto LAB_00233a6b;
              bVar22 = false;
              pcVar8 = afm_parser_next_key(parser,'\0',pFVar13);
              pFVar13 = extraout_RDX_20;
            } while (pcVar8 != (char *)0x0);
LAB_00233a54:
            AVar21 = 0xa0;
            goto LAB_00233a5a;
          }
          bVar22 = false;
          bVar3 = 5;
          pFVar13 = extraout_RDX_19;
          goto LAB_00233aa5;
        }
        if ((int)AVar5 < 0x14) {
          if (AVar5 == AFM_TOKEN_ASCENDER) {
            local_b8.type = AFM_VALUE_TYPE_FIXED;
            FVar6 = afm_parser_read_vals(parser,&local_b8,1);
            bVar3 = 5;
            pFVar13 = extraout_RDX_17;
            if (FVar6 != 1) goto LAB_00233af9;
            pAVar18->Ascender = CONCAT44(local_b8.u.f._4_4_,local_b8.u.i);
          }
          else if (AVar5 == AFM_TOKEN_DESCENDER) {
            local_b8.type = AFM_VALUE_TYPE_FIXED;
            FVar6 = afm_parser_read_vals(parser,&local_b8,1);
            bVar3 = 5;
            pFVar13 = extraout_RDX_00;
            if (FVar6 != 1) goto LAB_00233af9;
            pAVar18->Descender = CONCAT44(local_b8.u.f._4_4_,local_b8.u.i);
          }
          goto LAB_00233a06;
        }
        if (AVar5 != AFM_TOKEN_ENDFONTMETRICS) {
          if (AVar5 == AFM_TOKEN_FONTBBOX) {
            local_b8.type = AFM_VALUE_TYPE_FIXED;
            local_a8 = 2;
            local_98 = 2;
            local_88 = 2;
            FVar6 = afm_parser_read_vals(parser,&local_b8,4);
            bVar3 = 5;
            pFVar13 = extraout_RDX_02;
            if (FVar6 != 4) goto LAB_00233af9;
            (pAVar18->FontBBox).xMin = CONCAT44(local_b8.u.f._4_4_,local_b8.u.i);
            (pAVar18->FontBBox).yMin = CONCAT44(uStack_9c,local_a0);
            (pAVar18->FontBBox).xMax = CONCAT44(uStack_8c,local_90);
            (pAVar18->FontBBox).yMax = CONCAT44(uStack_7c,local_80);
          }
          goto LAB_00233a06;
        }
        AVar20 = AFM_VALUE_TYPE_STRING;
        goto LAB_00233af9;
      }
      goto LAB_00233b06;
    }
  }
  return FVar17;
  while( true ) {
    AVar5 = afm_tokenize(pcVar8,CONCAT44(local_b8._4_4_,local_b8.type));
    AVar21 = AFM_VALUE_TYPE_STRING;
    pFVar13 = extraout_RDX_22;
    if ((AVar5 == AFM_TOKEN_ENDFONTMETRICS) || (AVar5 == AFM_TOKEN_ENDCHARMETRICS)) break;
LAB_00233a6b:
    pcVar8 = afm_parser_next_key(parser,(FT_Bool)&local_b8,pFVar13);
    bVar22 = pcVar8 != (char *)0x0;
    pFVar13 = extraout_RDX_21;
    if (pcVar8 == (char *)0x0) goto LAB_00233a54;
  }
LAB_00233a5a:
  if (bVar22 == false) {
    AVar20 = AVar21;
  }
  bVar3 = bVar22 ^ 1;
LAB_00233aa5:
  AVar19 = AVar21;
  if (bVar22 != false) {
LAB_00233a06:
    bVar3 = 0;
    AVar21 = AVar19;
  }
LAB_00233af9:
  AVar19 = AVar21;
  if (bVar3 != 0) {
    if (bVar3 != 5) {
      return AVar20;
    }
LAB_00233b06:
    pFVar1 = local_38;
    ft_mem_free(local_38,pAVar18->TrackKerns);
    pAVar18->TrackKerns = (AFM_TrackKern)0x0;
    pAVar18->NumTrackKern = 0;
    ft_mem_free(pFVar1,pAVar18->KernPairs);
    pAVar18->KernPairs = (AFM_KernPair)0x0;
    pAVar18->NumKernPair = 0;
    pAVar18->IsCIDFont = '\0';
    return AVar21;
  }
  goto LAB_00233383;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* we only support kern data, so ... */
        FALL_THROUGH;

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }